

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::decode_lines(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
               *this)

{
  value_type vVar1;
  uint32_t uVar2;
  pointer __n;
  uint uVar3;
  coding_parameters *pcVar4;
  frame_info *pfVar5;
  uint *puVar6;
  reference pvVar7;
  reference pvVar8;
  pointer local_c8;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  quad<unsigned_short> local_a0;
  __normal_iterator<charls::quad<unsigned_short>_*,_std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>_>
  local_98;
  __normal_iterator<charls::quad<unsigned_short>_*,_std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>_>
  local_90;
  pointer local_88;
  size_t component;
  uint local_78;
  uint32_t mcu;
  uint32_t local_70;
  uint32_t lines_in_interval;
  uint32_t line;
  vector<int,_std::allocator<int>_> run_index;
  allocator<charls::quad<unsigned_short>_> local_39;
  undefined1 local_38 [8];
  vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_> line_buffer;
  size_t component_count;
  uint32_t pixel_stride;
  jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
  *this_local;
  
  uVar3 = this->width_ + 4;
  pcVar4 = parameters(this);
  if (pcVar4->interleave_mode == Line) {
    pfVar5 = frame_info(this);
    local_c8 = (pointer)(long)pfVar5->component_count;
  }
  else {
    local_c8 = (pointer)0x1;
  }
  line_buffer.
  super__Vector_base<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
  std::allocator<charls::quad<unsigned_short>_>::allocator(&local_39);
  std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>::vector
            ((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_> *
             )local_38,(long)local_c8 * (ulong)uVar3 * 2,&local_39);
  std::allocator<charls::quad<unsigned_short>_>::~allocator(&local_39);
  __n = line_buffer.
        super__Vector_base<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator((allocator<int> *)((long)&lines_in_interval + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&line,(size_type)__n,
             (allocator<int> *)((long)&lines_in_interval + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&lines_in_interval + 3));
  local_70 = 0;
  while( true ) {
    pfVar5 = frame_info(this);
    local_78 = pfVar5->height - local_70;
    puVar6 = std::min<unsigned_int>(&local_78,&this->restart_interval_);
    mcu = *puVar6;
    for (component._4_4_ = 0; uVar2 = local_70, component._4_4_ < mcu;
        component._4_4_ = component._4_4_ + 1) {
      pvVar7 = std::
               vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
               ::operator[]((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
                             *)local_38,1);
      this->previous_line_ = pvVar7;
      pvVar7 = std::
               vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
               ::operator[]((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
                             *)local_38,
                            (long)line_buffer.
                                  super__Vector_base<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage * (ulong)uVar3
                            + 1);
      this->current_line_ = pvVar7;
      if ((local_70 & 1) == 1) {
        std::swap<charls::quad<unsigned_short>*>(&this->previous_line_,&this->current_line_);
      }
      for (local_88 = (pointer)0x0;
          local_88 <
          line_buffer.
          super__Vector_base<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88 = (pointer)((long)&(local_88->super_triplet<unsigned_short>).field_0 + 1)) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_88);
        this->run_index_ = *pvVar8;
        this->previous_line_[this->width_] = this->previous_line_[this->width_ - 1];
        this->current_line_[-1] = *this->previous_line_;
        do_line(this,(quad<unsigned_short> *)0x0);
        vVar1 = this->run_index_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&line,(size_type)local_88);
        *pvVar8 = vVar1;
        this->previous_line_ = this->previous_line_ + uVar3;
        this->current_line_ = this->current_line_ + uVar3;
      }
      if (((uint)(this->rect_).Y <= local_70) &&
         (local_70 < (uint)((this->rect_).Y + (this->rect_).Height))) {
        decoder_strategy::on_line_end
                  (&this->super_decoder_strategy,
                   this->current_line_ +
                   ((long)(this->rect_).X -
                   (long)line_buffer.
                         super__Vector_base<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage * (ulong)uVar3),
                   (long)(this->rect_).Width,(ulong)uVar3);
      }
      local_70 = local_70 + 1;
    }
    pfVar5 = frame_info(this);
    if (uVar2 == pfVar5->height) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    local_90._M_current =
         (quad<unsigned_short> *)
         std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>::
         begin((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>
                *)local_38);
    local_98._M_current =
         (quad<unsigned_short> *)
         std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>::
         end((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_> *
             )local_38);
    quad<unsigned_short>::quad(&local_a0);
    std::
    fill<__gnu_cxx::__normal_iterator<charls::quad<unsigned_short>*,std::vector<charls::quad<unsigned_short>,std::allocator<charls::quad<unsigned_short>>>>,charls::quad<unsigned_short>>
              (local_90,local_98,&local_a0);
    local_a8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)&line);
    local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&line);
    local_b4 = 0;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_a8,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_b0,
               &local_b4);
    reset_parameters(this);
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&line);
  std::vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_>::~vector
            ((vector<charls::quad<unsigned_short>,_std::allocator<charls::quad<unsigned_short>_>_> *
             )local_38);
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }